

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O0

void Abc_NtkDumpEquivFile(char *pFileName,Vec_Int_t *vClasses,Abc_Ntk_t **pNtks)

{
  Abc_Ntk_t *pNtk_00;
  int iVar1;
  uint uVar2;
  FILE *__stream;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  Abc_Obj_t *pObj;
  char *pObjName;
  Abc_Ntk_t *pNtk;
  FILE *pFile;
  int Entry;
  int k;
  int c;
  int i;
  Abc_Ntk_t **pNtks_local;
  Vec_Int_t *vClasses_local;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file %s for writing.\n",pFileName);
  }
  else {
    pcVar3 = Abc_NtkName(*pNtks);
    pcVar4 = Abc_NtkName(pNtks[1]);
    pcVar5 = Extra_TimeStamp();
    fprintf(__stream,"# Node equivalences computed by ABC for networks \"%s\" and \"%s\" on %s\n\n",
            pcVar3,pcVar4,pcVar5);
    Entry = 0;
    for (k = 0; iVar1 = Vec_IntSize(vClasses), pFile._4_4_ = k, k < iVar1; k = iVar1 + 1 + k) {
      while( true ) {
        pFile._4_4_ = pFile._4_4_ + 1;
        iVar1 = Vec_IntEntry(vClasses,k);
        if (k + 1 + iVar1 <= pFile._4_4_) break;
        uVar2 = Vec_IntEntry(vClasses,pFile._4_4_);
        pNtk_00 = pNtks[(int)(uVar2 & 1)];
        pObj = Abc_NtkObj(pNtk_00,(int)uVar2 >> 2);
        pcVar3 = Abc_ObjName(pObj);
        pcVar4 = Abc_NtkName(pNtk_00);
        pcVar5 = "";
        if ((uVar2 & 2) != 0) {
          pcVar5 = "NOT:";
        }
        fprintf(__stream,"%d:%s:%s%s\n",(ulong)(Entry + 1),pcVar4,pcVar5,pcVar3);
      }
      fprintf(__stream,"\n");
      Entry = Entry + 1;
      iVar1 = Vec_IntEntry(vClasses,k);
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void Abc_NtkDumpEquivFile( char * pFileName, Vec_Int_t * vClasses, Abc_Ntk_t * pNtks[2] )
{
    int i, c, k, Entry;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL ) { printf( "Cannot open file %s for writing.\n", pFileName ); return; }
    fprintf( pFile, "# Node equivalences computed by ABC for networks \"%s\" and \"%s\" on %s\n\n", Abc_NtkName(pNtks[0]), Abc_NtkName(pNtks[1]), Extra_TimeStamp() );
    for ( i = c = 0; i < Vec_IntSize(vClasses); c++, i += 1 + Vec_IntEntry(vClasses, i) )
    {
        Vec_IntForEachEntryStartStop( vClasses, Entry, k, i + 1, i + 1 + Vec_IntEntry(vClasses, i) )
        {
            Abc_Ntk_t * pNtk = pNtks[Entry & 1];
            char * pObjName = Abc_ObjName( Abc_NtkObj(pNtk, Entry>>2) );
            fprintf( pFile, "%d:%s:%s%s\n", c+1, Abc_NtkName(pNtk), (Entry&2) ? "NOT:":"", pObjName );
        }
        fprintf( pFile, "\n" );
    }
    fclose( pFile );
}